

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_File * PHYSFS_openRead(char *_fname)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  char *pcVar4;
  int iVar5;
  FileHandle *pFVar6;
  size_t sVar7;
  long *plVar8;
  long lVar9;
  PHYSFS_Io *pPVar10;
  void **retval;
  long *plVar11;
  PHYSFS_ErrorCode PVar12;
  char *dst;
  __PHYSFS_DIRHANDLE__ *h;
  long lStack_48;
  char *local_40;
  char *arcfname;
  
  plVar11 = &lStack_48;
  if (_fname == (char *)0x0) {
    PVar12 = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    if ((magicStream == (FileHandle *)0x0) || (magicStream->forReading == '\0')) {
      __PHYSFS_platformGrabMutex(stateLock);
      if (searchPath == (DirHandle *)0x0) {
        PVar12 = PHYSFS_ERR_NOT_FOUND;
LAB_001097a7:
        PHYSFS_setErrorCode(PVar12);
        __PHYSFS_platformReleaseMutex(stateLock);
        return (PHYSFS_File *)0x0;
      }
      sVar7 = strlen(_fname);
      if (sVar7 + longest_root + 1 < 0x100) {
        plVar8 = (long *)((long)&lStack_48 - (longest_root + sVar7 + 0x18 & 0xfffffffffffffff0));
        lVar9 = 0;
        plVar11 = plVar8;
      }
      else {
        plVar8 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar7 + 9);
        if (plVar8 == (long *)0x0) {
          PVar12 = PHYSFS_ERR_OUT_OF_MEMORY;
          goto LAB_001097a7;
        }
        lVar9 = 1;
      }
      *plVar8 = lVar9;
      dst = (char *)((long)plVar8 + longest_root + 8);
      plVar11[-1] = 0x109739;
      iVar5 = sanitizePlatformIndependentPath(_fname,dst);
      if (searchPath == (DirHandle *)0x0 || iVar5 == 0) {
        pFVar6 = (FileHandle *)0x0;
      }
      else {
        pFVar6 = (FileHandle *)0x0;
        h = searchPath;
        arcfname = (char *)plVar8;
        do {
          local_40 = dst;
          plVar11[-1] = 0x109773;
          iVar5 = verifyPath(h,&local_40,0);
          pcVar4 = local_40;
          if (iVar5 != 0) {
            pvVar1 = h->opaque;
            p_Var2 = h->funcs->openRead;
            plVar11[-1] = 0x109785;
            pPVar10 = (*p_Var2)(pvVar1,pcVar4);
            if (pPVar10 != (PHYSFS_Io *)0x0) {
              plVar11[-1] = 0x1097db;
              pFVar6 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
              if (pFVar6 == (FileHandle *)0x0) {
                p_Var3 = pPVar10->destroy;
                plVar11[-1] = 0x1097e9;
                (*p_Var3)(pPVar10);
                plVar11[-1] = 0x1097f3;
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
              }
              *(undefined8 *)&pFVar6->forReading = 0;
              pFVar6->dirHandle = (DirHandle *)0x0;
              pFVar6->buffill = 0;
              pFVar6->bufpos = 0;
              pFVar6->buffer = (PHYSFS_uint8 *)0x0;
              pFVar6->bufsize = 0;
              pFVar6->io = pPVar10;
              pFVar6->forReading = '\x01';
              pFVar6->dirHandle = h;
              pFVar6->next = openReadList;
              plVar8 = (long *)arcfname;
              openReadList = pFVar6;
              break;
            }
          }
          h = h->next;
          plVar8 = (long *)arcfname;
        } while (h != (__PHYSFS_DIRHANDLE__ *)0x0);
      }
      plVar11[-1] = 0x109833;
      __PHYSFS_platformReleaseMutex(stateLock);
      if (*plVar8 != 0) {
        plVar11[-1] = 0x109842;
        (*__PHYSFS_AllocatorHooks.Free)(plVar8);
        return (PHYSFS_File *)pFVar6;
      }
      return (PHYSFS_File *)pFVar6;
    }
    pFVar6 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
    if (pFVar6 != (FileHandle *)0x0) {
      pFVar6->io = (PHYSFS_Io *)0x0;
      *(undefined8 *)&pFVar6->forReading = 0;
      pFVar6->bufsize = 0;
      pFVar6->buffill = 0;
      pFVar6->dirHandle = (DirHandle *)0x0;
      pFVar6->buffer = (PHYSFS_uint8 *)0x0;
      pFVar6->bufpos = 0;
      pFVar6->forReading = '\x01';
      pFVar6->next = openReadList;
      openReadList = pFVar6;
      return (PHYSFS_File *)pFVar6;
    }
    PVar12 = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  PHYSFS_setErrorCode(PVar12);
  return (PHYSFS_File *)0x0;
}

Assistant:

PHYSFS_File *PHYSFS_openRead(const char *_fname)
{
    FileHandle *fh = NULL;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    if (magicStream && magicStream->forReading)
    {
        /* magic stream replay: file opens are NOPs, so
           we'll create a dummy file handle. */
        fh = (FileHandle *)allocator.Malloc(sizeof(FileHandle));
        if (fh == NULL)
        {
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            return NULL;
        } /* if */

        memset(fh, '\0', sizeof(FileHandle));
        fh->io = 0;
        fh->forReading = 1;
        fh->dirHandle = 0;
        fh->next = openReadList;
        openReadList = fh;

        return ((PHYSFS_File *)fh);
    } /* if */

    __PHYSFS_platformGrabMutex(stateLock);

    BAIL_IF_MUTEX(!searchPath, PHYSFS_ERR_NOT_FOUND, stateLock, 0);

    len = strlen(_fname) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *i;

        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (verifyPath(i, &arcfname, 0))
            {
                io = i->funcs->openRead(i->opaque, arcfname);
                if (io)
                    break;
            } /* if */
        } /* for */

        if (io)
        {
            fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
            if (fh == NULL)
            {
                io->destroy(io);
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            } /* if */

            memset(fh, '\0', sizeof (FileHandle));
            fh->io = io;
            fh->forReading = 1;
            fh->dirHandle = i;
            fh->next = openReadList;
            openReadList = fh;
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return ((PHYSFS_File *) fh);
}